

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FilenameToClassname_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view filename)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  ulong local_60;
  size_t i;
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined1 local_29;
  size_type local_28;
  size_t lastindex;
  string_view filename_local;
  string *result;
  
  filename_local._M_len = filename._M_len;
  lastindex = (size_t)this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)&lastindex,'.',
                        0xffffffffffffffff);
  local_29 = 0;
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&lastindex,0,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_40,&local_41);
  std::allocator<char>::~allocator(&local_41);
  for (local_60 = 0; uVar1 = std::__cxx11::string::size(), local_60 < uVar1; local_60 = local_60 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar2 == '/') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar3 = 0x5c;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameToClassname(absl::string_view filename) {
  size_t lastindex = filename.find_last_of('.');
  std::string result(filename.substr(0, lastindex));
  for (size_t i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}